

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

void __thiscall TCV::visit(TCV *this,CompareOp *node)

{
  bool bVar1;
  ASTNode *pAVar2;
  string local_c8 [32];
  string local_a8;
  undefined1 local_88 [8];
  string errorString;
  string rhsType;
  undefined1 local_38 [8];
  string lhsType;
  CompareOp *node_local;
  TCV *this_local;
  
  lhsType.field_2._8_8_ = node;
  pAVar2 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  (**pAVar2->_vptr_ASTNode)(pAVar2,this);
  std::__cxx11::string::string((string *)local_38,(string *)&this->returnType);
  pAVar2 = AST::ASTNode::getChild((ASTNode *)lhsType.field_2._8_8_,2);
  (**pAVar2->_vptr_ASTNode)(pAVar2,this);
  std::__cxx11::string::string
            ((string *)(errorString.field_2._M_local_buf + 8),(string *)&this->returnType);
  bVar1 = isMatchType((string *)local_38,(string *)((long)&errorString.field_2 + 8));
  if (!bVar1) {
    std::__cxx11::to_string(&local_a8,this->position);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "Unmatched type at line ",&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    Semantic::Detector::addError(this->detector,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  std::__cxx11::string::string(local_c8);
  std::__cxx11::string::operator=((string *)&this->returnType,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)(errorString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void TCV::visit(CompareOp *node) {
    node->getChild(0)->accept(*this);
    std::string lhsType = returnType;
    node->getChild(2)->accept(*this);
    std::string rhsType = returnType;
    if (!isMatchType(lhsType, rhsType)) {
        std::string errorString = "Unmatched type at line " + std::to_string(position);
        detector->addError(errorString);
    }
    returnType = std::string();
}